

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O0

void ClearDictionary(void)

{
  DictionaryEntry *pDVar1;
  DictionaryEntry *next_entry;
  DictionaryEntry *entry;
  
  next_entry = dictionary_head;
  while (next_entry != (DictionaryEntry *)0x0) {
    pDVar1 = next_entry->next;
    free(next_entry);
    next_entry = pDVar1;
  }
  dictionary_head = (DictionaryEntry *)0x0;
  return;
}

Assistant:

void ClearDictionary(void)
{
	DictionaryEntry *entry = dictionary_head;
	while (entry != NULL)
	{
		DictionaryEntry *next_entry = entry->next;
		free(entry);
		entry = next_entry;
	}

	dictionary_head = NULL;
}